

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall Logger::~Logger(Logger *this)

{
  thread *ptVar1;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar2;
  
  if (this->l_asyncw_thread != (thread *)0x0) {
    LOCK();
    (this->is_thread_stop)._M_base._M_i = true;
    UNLOCK();
    if ((this->l_asyncw_thread->_M_id)._M_thread != 0) {
      std::condition_variable::notify_all();
      std::thread::join();
    }
    ptVar1 = this->l_asyncw_thread;
    if (ptVar1 != (thread *)0x0) {
      if ((ptVar1->_M_id)._M_thread != 0) {
        std::terminate();
      }
      operator_delete(ptVar1,8);
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->l_mutex);
  if (iVar2 == 0) {
    if ((FILE *)this->l_fp != (FILE *)0x0) {
      fclose((FILE *)this->l_fp);
    }
    if (this->l_buf != (char *)0x0) {
      operator_delete__(this->l_buf);
    }
    this_00 = this->l_buffer_queue;
    if (this_00 !=
        (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~buffer_queue(this_00);
      operator_delete(this_00,0x88);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->l_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

Logger::~Logger()
{
    if(l_asyncw_thread)
    {
        is_thread_stop = true;
        if(l_asyncw_thread->joinable())
        {
            l_buffer_queue->notify();
            l_asyncw_thread->join();
        }
        delete l_asyncw_thread;
    }

    lock_guard<mutex> lck (l_mutex);
    if (l_fp != NULL)
    {
        fclose(l_fp);
    }

    if(l_buf)
    {
        delete [] l_buf;
    }

    if(l_buffer_queue)
    {
        delete l_buffer_queue;
    }
}